

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O0

void kernel_to_references<double,int>
               (TreesIndexer *indexer,IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,
               double *numeric_data,int *categ_data,double *Xc,int *Xc_ind,int *Xc_indptr,
               bool is_col_major,size_t ld_numeric,size_t ld_categ,size_t nrows,int nthreads,
               double *rmat,bool standardize)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_type sVar4;
  reference pvVar5;
  size_type sVar6;
  ulong uVar7;
  int *Xr_ind;
  pointer piVar8;
  void *__s;
  reference pvVar9;
  value_type vVar10;
  byte bVar11;
  int *in_RCX;
  size_t in_RDX;
  int in_ESI;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_RDI;
  int *in_R9;
  undefined1 auVar12 [16];
  SignalSwitcher *in_stack_00000008;
  SignalSwitcher *in_stack_00000010;
  byte in_stack_00000018;
  int *in_stack_00000020;
  double *in_stack_00000028;
  ulong in_stack_00000030;
  long in_stack_00000040;
  byte in_stack_00000048;
  size_t ix;
  double ntrees_dbl;
  size_t ind;
  size_t tree;
  double *rmat_this;
  int *terminal_indices_this;
  size_t idx_this;
  SingleTreeIndex *index_node;
  size_t row;
  unique_ptr<double[],_std::default_delete<double[]>_> ignored;
  unique_ptr<int[],_std::default_delete<int[]>_> terminal_indices;
  SignalSwitcher ss;
  size_t n_ref;
  size_t ntrees;
  double *in_stack_fffffffffffffdc8;
  SignalSwitcher *in_stack_fffffffffffffdd0;
  SignalSwitcher *Xc_00;
  SignalSwitcher *ncols_categ;
  SignalSwitcher *ncols_numeric;
  undefined1 is_col_major_00;
  int *categ_data_00;
  SignalSwitcher *local_168;
  SignalSwitcher *local_158;
  undefined7 in_stack_fffffffffffffed0;
  IsoForest *in_stack_ffffffffffffff10;
  ExtIsoForest *in_stack_ffffffffffffff18;
  double *in_stack_ffffffffffffff20;
  ulong __n;
  int *in_stack_ffffffffffffff28;
  double *in_stack_ffffffffffffff30;
  void *pvVar13;
  TreesIndexer *in_stack_ffffffffffffff38;
  ulong local_b0;
  
  bVar11 = in_stack_00000018 & 1;
  sVar4 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::size(in_RDI);
  pvVar5 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front
                     ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                      in_stack_fffffffffffffdd0);
  sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    (&pvVar5->reference_points);
  SignalSwitcher::SignalSwitcher(in_stack_fffffffffffffdd0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_stack_00000030 * sVar4;
  uVar7 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  operator_new__(uVar7);
  std::unique_ptr<int[],std::default_delete<int[]>>::
  unique_ptr<int*,std::default_delete<int[]>,void,bool>
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_fffffffffffffdd0,
             (int *)in_stack_fffffffffffffdc8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_stack_00000030;
  uVar7 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  Xr_ind = (int *)operator_new__(uVar7);
  std::unique_ptr<double[],std::default_delete<double[]>>::
  unique_ptr<double*,std::default_delete<double[]>,void,bool>
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8);
  if (bVar11 == 0) {
    local_158 = (SignalSwitcher *)0x0;
    local_168 = (SignalSwitcher *)0x0;
    Xc_00 = in_stack_00000010;
    in_stack_00000010 = local_168;
  }
  else {
    in_R9 = (int *)0x0;
    Xc_00 = (SignalSwitcher *)0x0;
    local_158 = in_stack_00000008;
    in_stack_00000008 = (SignalSwitcher *)0x0;
  }
  ncols_categ = in_stack_00000008;
  ncols_numeric = in_stack_00000008;
  categ_data_00 = in_R9;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::get
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffdd0);
  is_col_major_00 = (undefined1)((ulong)in_R9 >> 0x38);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::get
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_fffffffffffffdd0);
  predict_iforest((double *)in_stack_00000010,categ_data_00,(bool)is_col_major_00,
                  (size_t)ncols_numeric,(size_t)ncols_categ,(double *)Xc_00,
                  (int *)CONCAT17(bVar11,in_stack_fffffffffffffed0),in_stack_00000020,
                  in_stack_00000028,Xr_ind,in_RCX,in_RDX,in_ESI,
                  SUB81((ulong)&stack0xfffffffffffffdc8 >> 0x38,0),in_stack_ffffffffffffff10,
                  in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                  in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::reset
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_00000010,local_158);
  check_interrupt_switch(in_stack_00000008);
  for (local_b0 = 0; local_b0 < in_stack_00000030; local_b0 = local_b0 + 1) {
    if ((interrupt_switch & 1U) == 0) {
      piVar8 = std::unique_ptr<int[],_std::default_delete<int[]>_>::get
                         ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_00000010);
      piVar8 = piVar8 + local_b0;
      __s = (void *)(in_stack_00000040 + local_b0 * sVar6 * 8);
      memset(__s,0,sVar6 << 3);
      for (uVar7 = 0; uVar7 < sVar4; uVar7 = uVar7 + 1) {
        iVar1 = piVar8[uVar7 * in_stack_00000030];
        pvVar5 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::operator[]
                           (in_RDI,uVar7);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&pvVar5->reference_indptr,(long)iVar1);
        vVar10 = *pvVar9;
        while (__n = vVar10,
              pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&pvVar5->reference_indptr,(long)iVar1 + 1), vVar10 < *pvVar9) {
          pvVar13 = __s;
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&pvVar5->reference_mapping,__n);
          *(double *)((long)__s + *pvVar9 * 8) = *(double *)((long)__s + *pvVar9 * 8) + 1.0;
          __s = pvVar13;
          vVar10 = __n + 1;
        }
      }
    }
  }
  check_interrupt_switch(in_stack_00000008);
  if ((in_stack_00000048 & 1) != 0) {
    auVar12._8_4_ = (int)(sVar4 >> 0x20);
    auVar12._0_8_ = sVar4;
    auVar12._12_4_ = 0x45300000;
    for (uVar7 = 0; uVar7 < in_stack_00000030 * sVar6; uVar7 = uVar7 + 1) {
      *(double *)(in_stack_00000040 + uVar7 * 8) =
           *(double *)(in_stack_00000040 + uVar7 * 8) /
           ((auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
    }
  }
  check_interrupt_switch(in_stack_00000008);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_00000010);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_00000010);
  SignalSwitcher::~SignalSwitcher(in_stack_00000010);
  return;
}

Assistant:

void kernel_to_references(TreesIndexer &indexer,
                          IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                          real_t *restrict numeric_data, int *restrict categ_data,
                          real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                          bool is_col_major, size_t ld_numeric, size_t ld_categ,
                          size_t nrows, int nthreads,
                          double *restrict rmat,
                          bool standardize)
{
    size_t ntrees = indexer.indices.size();
    size_t n_ref = indexer.indices.front().reference_points.size();

    SignalSwitcher ss;

    std::unique_ptr<sparse_ix[]> terminal_indices(new sparse_ix[nrows*ntrees]);
    std::unique_ptr<double[]> ignored(new double[nrows]);
    predict_iforest(numeric_data, categ_data,
                    is_col_major, ld_numeric, ld_categ,
                    is_col_major? Xc : nullptr, is_col_major? Xc_ind : nullptr, is_col_major? Xc_indptr : nullptr,
                    is_col_major? (real_t*)nullptr : Xc, is_col_major? (sparse_ix*)nullptr : Xc_ind, is_col_major? (sparse_ix*)nullptr : Xc_indptr,
                    nrows, nthreads, false,
                    model_outputs, model_outputs_ext,
                    ignored.get(), terminal_indices.get(),
                    (double*)NULL,
                    &indexer);
    ignored.reset();

    check_interrupt_switch(ss);

    #pragma omp parallel for schedule(static) num_threads(nthreads) \
            shared(indexer, terminal_indices, nrows, ntrees, n_ref, rmat)
    for (size_t_for row = 0; row < (decltype(row))nrows; row++)
    {
        if (interrupt_switch) continue;

        SingleTreeIndex *restrict index_node;
        size_t idx_this;
        sparse_ix *restrict terminal_indices_this = terminal_indices.get() + row;
        double *restrict rmat_this = rmat + row*n_ref;
        memset(rmat_this, 0, n_ref*sizeof(double));

        for (size_t tree = 0; tree < ntrees; tree++)
        {
            idx_this = terminal_indices_this[tree*nrows];
            index_node = &indexer.indices[tree];
            for (size_t ind = index_node->reference_indptr[idx_this];
                 ind < index_node->reference_indptr[idx_this + 1];
                 ind++)
            {
                rmat_this[index_node->reference_mapping[ind]]++;
            }
        }
    }

    check_interrupt_switch(ss);

    if (standardize)
    {
        double ntrees_dbl = (double)ntrees;
        for (size_t ix = 0; ix < nrows*n_ref; ix++)
            rmat[ix] /= ntrees_dbl;
    }

    check_interrupt_switch(ss);
}